

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O3

void __thiscall
icu_63::NFSubstitution::NFSubstitution
          (NFSubstitution *this,int32_t _pos,NFRuleSet *_ruleSet,UnicodeString *description,
          UErrorCode *status)

{
  short sVar1;
  char16_t cVar2;
  NFRuleSet *pNVar3;
  DecimalFormatSymbols *symbols;
  DecimalFormat *this_00;
  uint uVar4;
  size_t size;
  char16_t *pcVar5;
  UnicodeString workingDescription;
  UnicodeString local_60;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__NFSubstitution_003d6c80;
  this->pos = _pos;
  this->ruleSet = (NFRuleSet *)0x0;
  this->numberFormat = (DecimalFormat *)0x0;
  UnicodeString::UnicodeString(&local_60,description);
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (description->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  size = (size_t)uVar4;
  if ((int)uVar4 < 2) {
    if (uVar4 == 0) goto LAB_00257c19;
  }
  else {
    if (((int)sVar1 & 2U) == 0) {
      pcVar5 = (description->fUnion).fFields.fArray;
    }
    else {
      pcVar5 = (description->fUnion).fStackFields.fBuffer;
    }
    if (*pcVar5 == pcVar5[uVar4 - 1]) {
      UnicodeString::doReplace(&local_60,uVar4 - 1,1,(UChar *)0x0,0,0);
      size = 0;
      UnicodeString::doReplace(&local_60,0,1,(UChar *)0x0,0,0);
LAB_00257c19:
      if (-1 < local_60.fUnion.fStackFields.fLengthAndFlags) {
        local_60.fUnion.fFields.fLength = (int)local_60.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (local_60.fUnion.fFields.fLength == 0) {
        this->ruleSet = _ruleSet;
        goto LAB_00257c97;
      }
      if (((int)local_60.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_60.fUnion.fFields.fArray = local_60.fUnion.fStackFields.fBuffer;
      }
      cVar2 = *local_60.fUnion.fFields.fArray;
      if ((ushort)cVar2 < 0x30) {
        if (cVar2 == L'#') {
LAB_00257cad:
          symbols = RuleBasedNumberFormat::getDecimalFormatSymbols(_ruleSet->owner);
          if (symbols == (DecimalFormatSymbols *)0x0) {
            *status = U_MISSING_RESOURCE_ERROR;
          }
          else {
            this_00 = (DecimalFormat *)UMemory::operator_new((UMemory *)0x170,size);
            if (this_00 == (DecimalFormat *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              DecimalFormat::DecimalFormat(this_00,&local_60,symbols,status);
              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                this->numberFormat = this_00;
              }
              else {
                (*(this_00->super_NumberFormat).super_Format.super_UObject._vptr_UObject[1])
                          (this_00);
              }
            }
          }
          goto LAB_00257c97;
        }
        if (cVar2 == L'%') {
          pNVar3 = RuleBasedNumberFormat::findRuleSet(_ruleSet->owner,&local_60,status);
          this->ruleSet = pNVar3;
          goto LAB_00257c97;
        }
      }
      else {
        if (cVar2 == L'0') goto LAB_00257cad;
        if (cVar2 == L'>') {
          this->ruleSet = _ruleSet;
          this->numberFormat = (DecimalFormat *)0x0;
          goto LAB_00257c97;
        }
      }
    }
  }
  *status = U_PARSE_ERROR;
LAB_00257c97:
  UnicodeString::~UnicodeString(&local_60);
  return;
}

Assistant:

NFSubstitution::NFSubstitution(int32_t _pos,
                               const NFRuleSet* _ruleSet,
                               const UnicodeString& description,
                               UErrorCode& status)
                               : pos(_pos), ruleSet(NULL), numberFormat(NULL)
{
    // the description should begin and end with the same character.
    // If it doesn't that's a syntax error.  Otherwise,
    // makeSubstitution() was the only thing that needed to know
    // about these characters, so strip them off
    UnicodeString workingDescription(description);
    if (description.length() >= 2
        && description.charAt(0) == description.charAt(description.length() - 1))
    {
        workingDescription.remove(description.length() - 1, 1);
        workingDescription.remove(0, 1);
    }
    else if (description.length() != 0) {
        // throw new IllegalArgumentException("Illegal substitution syntax");
        status = U_PARSE_ERROR;
        return;
    }

    if (workingDescription.length() == 0) {
        // if the description was just two paired token characters
        // (i.e., "<<" or ">>"), it uses the rule set it belongs to to
        // format its result
        this->ruleSet = _ruleSet;
    }
    else if (workingDescription.charAt(0) == gPercent) {
        // if the description contains a rule set name, that's the rule
        // set we use to format the result: get a reference to the
        // names rule set
        this->ruleSet = _ruleSet->getOwner()->findRuleSet(workingDescription, status);
    }
    else if (workingDescription.charAt(0) == gPound || workingDescription.charAt(0) ==gZero) {
        // if the description begins with 0 or #, treat it as a
        // DecimalFormat pattern, and initialize a DecimalFormat with
        // that pattern (then set it to use the DecimalFormatSymbols
        // belonging to our formatter)
        const DecimalFormatSymbols* sym = _ruleSet->getOwner()->getDecimalFormatSymbols();
        if (!sym) {
            status = U_MISSING_RESOURCE_ERROR;
            return;
        }
        DecimalFormat *tempNumberFormat = new DecimalFormat(workingDescription, *sym, status);
        /* test for NULL */
        if (!tempNumberFormat) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if (U_FAILURE(status)) {
            delete tempNumberFormat;
            return;
        }
        this->numberFormat = tempNumberFormat;
    }
    else if (workingDescription.charAt(0) == gGreaterThan) {
        // if the description is ">>>", this substitution bypasses the
        // usual rule-search process and always uses the rule that precedes
        // it in its own rule set's rule list (this is used for place-value
        // notations: formats where you want to see a particular part of
        // a number even when it's 0)

        // this causes problems when >>> is used in a frationalPartSubstitution
        // this->ruleSet = NULL;
        this->ruleSet = _ruleSet;
        this->numberFormat = NULL;
    }
    else {
        // and of the description is none of these things, it's a syntax error

        // throw new IllegalArgumentException("Illegal substitution syntax");
        status = U_PARSE_ERROR;
    }
}